

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O3

void __thiscall r_exec::PGMController::reduce(PGMController *this,View *input)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *plVar1;
  uint64_t uVar2;
  __atomic_base<long> _Var3;
  int __e;
  int iVar4;
  long lVar5;
  _Object *p_Var6;
  undefined4 extraout_var_00;
  const_iterator cVar7;
  const_iterator cVar8;
  const_iterator local_48;
  P<r_exec::Overlay> local_38;
  undefined4 extraout_var;
  
  local_48.super__iterator._cell = -1;
  local_48._list = (list<core::P<r_exec::Overlay>_> *)0x0;
  uVar2 = (this->super__PGMController).super_OController.super_Controller.tsc;
  __mutex = &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (uVar2 == 0) {
    if (iVar4 != 0) goto LAB_001962c0;
    plVar1 = &(this->super__PGMController).super_OController.overlays;
    local_48.super__iterator._cell =
         (this->super__PGMController).super_OController.overlays.used_cells_head;
    cVar8._list = plVar1;
    cVar8.super__iterator._cell = local_48.super__iterator._cell;
    local_48._list = plVar1;
    if (local_48.super__iterator._cell != -1) {
      do {
        iVar4 = (*(((cVar8._list)->cells).
                   super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[cVar8.super__iterator._cell._cell].data
                  .object)->_vptr__Object[4])();
        if ((char)iVar4 == '\0') {
          p_Var6 = ((local_48._list)->cells).
                   super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_48.super__iterator._cell].data.
                   object;
          iVar4 = (*p_Var6->_vptr__Object[3])(p_Var6,input);
          p_Var6 = (_Object *)CONCAT44(extraout_var_00,iVar4);
          if (p_Var6 != (_Object *)0x0) {
            LOCK();
            (p_Var6->refCount).super___atomic_base<long>._M_i =
                 (p_Var6->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
            local_38.object = p_Var6;
            r_code::list<core::P<r_exec::Overlay>_>::push_front(plVar1,&local_38);
            if (local_38.object != (_Object *)0x0) {
              LOCK();
              ((local_38.object)->refCount).super___atomic_base<long>._M_i =
                   ((local_38.object)->refCount).super___atomic_base<long>._M_i + -1;
              UNLOCK();
              if (((local_38.object)->refCount).super___atomic_base<long>._M_i < 1) {
                (*(local_38.object)->_vptr__Object[1])();
              }
            }
          }
          if (((this->super__PGMController).super_OController.super_Controller.invalidated != 0) ||
             ((this->super__PGMController).super_OController.super_Controller.activated != 1))
          break;
          cVar8._list = local_48._list;
          cVar8.super__iterator._cell =
               ((local_48._list)->cells).
               super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[local_48.super__iterator._cell].next;
        }
        else {
          cVar8 = r_code::list<core::P<r_exec::Overlay>_>::erase(plVar1,&local_48);
          local_48._list = cVar8._list;
        }
        local_48.super__iterator = cVar8.super__iterator._cell;
      } while (local_48.super__iterator._cell != -1);
    }
  }
  else {
    if (iVar4 != 0) {
LAB_001962c0:
      std::__throw_system_error(iVar4);
    }
    lVar5 = (*Now)();
    plVar1 = &(this->super__PGMController).super_OController.overlays;
    local_48.super__iterator._cell =
         (this->super__PGMController).super_OController.overlays.used_cells_head;
    cVar7._list = plVar1;
    cVar7.super__iterator._cell = local_48.super__iterator._cell;
    local_48._list = plVar1;
    while (local_48.super__iterator._cell != -1) {
      iVar4 = (*(((cVar7._list)->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[cVar7.super__iterator._cell._cell].data.
                object)->_vptr__Object[4])();
      if ((char)iVar4 == '\0') {
        p_Var6 = ((local_48._list)->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_48.super__iterator._cell].data.
                 object;
        _Var3._M_i = p_Var6[8].refCount.super___atomic_base<long>._M_i;
        if ((_Var3._M_i != 0) &&
           ((this->super__PGMController).super_OController.super_Controller.tsc <
            (ulong)(lVar5 - _Var3._M_i))) {
          cVar7 = r_code::list<core::P<r_exec::Overlay>_>::erase(plVar1,&local_48);
          goto LAB_00196140;
        }
        iVar4 = (*p_Var6->_vptr__Object[3])(p_Var6,input);
        p_Var6 = (_Object *)CONCAT44(extraout_var,iVar4);
        if (p_Var6 != (_Object *)0x0) {
          LOCK();
          (p_Var6->refCount).super___atomic_base<long>._M_i =
               (p_Var6->refCount).super___atomic_base<long>._M_i + 1;
          UNLOCK();
          local_38.object = p_Var6;
          r_code::list<core::P<r_exec::Overlay>_>::push_front(plVar1,&local_38);
          if (local_38.object != (_Object *)0x0) {
            LOCK();
            ((local_38.object)->refCount).super___atomic_base<long>._M_i =
                 ((local_38.object)->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if (((local_38.object)->refCount).super___atomic_base<long>._M_i < 1) {
              (*(local_38.object)->_vptr__Object[1])();
            }
          }
        }
        if (((this->super__PGMController).super_OController.super_Controller.invalidated != 0) ||
           ((this->super__PGMController).super_OController.super_Controller.activated != 1)) break;
        cVar7._list = local_48._list;
        cVar7.super__iterator._cell =
             ((local_48._list)->cells).
             super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[local_48.super__iterator._cell].next;
      }
      else {
        cVar7 = r_code::list<core::P<r_exec::Overlay>_>::erase(plVar1,&local_48);
LAB_00196140:
        local_48._list = cVar7._list;
      }
      local_48.super__iterator = cVar7.super__iterator._cell;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void PGMController::reduce(r_exec::View *input)
{
    r_code::list<P<Overlay> >::const_iterator o;

    //uint64_t oid=input->object->get_oid();
    //uint64_t t=Now()-Utils::GetTimeReference();
    //std::cout<<Time::ToString_seconds(t)<<" got "<<oid<<" "<<input->get_sync()<<std::endl;
    if (tsc > 0) {
        std::lock_guard<std::mutex> guard(m_reductionMutex);
        uint64_t now = Now(); // call must be located after the CS.enter() since (*o)->reduce() may update (*o)->birth_time.

        //uint64_t t=now-Utils::GetTimeReference();
        for (o = overlays.begin(); o != overlays.end();) {
            if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                uint64_t birth_time = ((PGMOverlay *)*o)->get_birth_time();

                if (birth_time > 0 && now - birth_time > tsc) {
                    //std::cout<<Time::ToString_seconds(t)<<" kill "<<std::hex<<(void *)*o<<std::dec<<" born: "<<Time::ToString_seconds(birth_time-Utils::GetTimeReference())<<" after "<<Time::ToString_seconds(now-birth_time)<<std::endl;
                    //std::cout<<std::hex<<(void *)*o<<std::dec<<" ------------kill "<<input->object->get_oid()<<" ignored "<<std::endl;
                    o = overlays.erase(o);
                } else {
                    //void *oo=*o;
                    Overlay *offspring = (*o)->reduce_view(input);

                    if (offspring) {
                        overlays.push_front(offspring);
                        //std::cout<<Time::ToString_seconds(t)<<" "<<std::hex<<oo<<std::dec<<" born: "<<Time::ToString_seconds(((PGMOverlay *)oo)->get_birth_time()-Utils::GetTimeReference())<<" reduced "<<input->object->get_oid()<<" "<<input->get_sync()<<" offspring: "<<std::hex<<offspring<<std::dec<<std::endl;
                        //std::cout<<std::hex<<(void *)oo<<std::dec<<" --------------- reduced "<<input->object->get_oid()<<" "<<input->get_sync()<<std::endl;
                    }

                    if (!is_alive()) {
                        break;
                    }

                    ++o;
                }
            }
        }
    } else {
        std::lock_guard<std::mutex> guard(m_reductionMutex);

        for (o = overlays.begin(); o != overlays.end();) {
            if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                Overlay *offspring = (*o)->reduce_view(input);

                if (offspring) {
                    overlays.push_front(offspring);
                }

                if (!is_alive()) {
                    break;
                }

                ++o;
            }
        }
    }
}